

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool FIX::Message::InitializeXML(string *url)

{
  long lVar1;
  DataDictionary *this;
  
  this = (DataDictionary *)operator_new(1000);
  DataDictionary::DataDictionary(this,url,false);
  if (s_dataDictionary != (DataDictionary *)0x0) {
    lVar1 = *(long *)s_dataDictionary;
    s_dataDictionary = this;
    (**(code **)(lVar1 + 8))();
    this = s_dataDictionary;
  }
  s_dataDictionary = this;
  return true;
}

Assistant:

bool Message::InitializeXML( const std::string& url )
{
  try
  {
    s_dataDictionary.reset(new DataDictionary(url));
    return true;
  }
  catch( ConfigError& )
  { return false; }
}